

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nmq.c
# Opt level: O0

void nmq_set_interval(NMQ *q,uint32_t interval)

{
  uint32_t interval_local;
  NMQ *q_local;
  
  if (q->inited == '\0') {
    if (interval < 0x2711) {
      if (interval < 10) {
        q->flush_interval = 10;
      }
      else {
        q->flush_interval = (uint16_t)interval;
      }
    }
    else {
      q->flush_interval = 10000;
    }
  }
  return;
}

Assistant:

void nmq_set_interval(NMQ *q, uint32_t interval) {
    if (!q->inited) {
        if (interval > INTERVAL_MAX_MS) {
            q->flush_interval = INTERVAL_MAX_MS;
        } else if (interval < INTERVAL_MIN_MS) {
            q->flush_interval = INTERVAL_MIN_MS;
        } else {
            q->flush_interval = interval;
        }
    }
}